

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::PIQBase::VerifyGetProgramResourceiv
          (PIQBase *this,GLuint program,GLenum programInterface,GLuint index,GLsizei propCount,
          GLenum *props,GLsizei expectedLength,GLint *expected,long *error)

{
  uint local_fdc;
  uint local_fd8;
  int i;
  GLint params [1000];
  uint local_30 [2];
  GLsizei length;
  GLsizei bufSize;
  GLenum *props_local;
  GLsizei propCount_local;
  GLuint index_local;
  GLenum programInterface_local;
  GLuint program_local;
  PIQBase *this_local;
  
  local_30[1] = 1000;
  _length = props;
  props_local._0_4_ = propCount;
  props_local._4_4_ = index;
  propCount_local = programInterface;
  index_local = program;
  _programInterface_local = this;
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
             programInterface,index,propCount,props,1000,(GLsizei *)local_30,(GLint *)&local_fd8);
  if ((local_30[0] == expectedLength) && (0 < (int)local_30[0])) {
    for (local_fdc = 0; (int)local_fdc < (int)local_30[0]; local_fdc = local_fdc + 1) {
      if ((&local_fd8)[(int)local_fdc] != expected[(int)local_fdc]) {
        *error = -1;
        anon_unknown_0::Output
                  ("ERROR: Got %d, expected %d at: %d\n",(ulong)(&local_fd8)[(int)local_fdc],
                   (ulong)(uint)expected[(int)local_fdc],(ulong)local_fdc);
        anon_unknown_0::Output
                  ("CALL: glGetProgramResourceiv, with %d, %d\n",(ulong)(uint)propCount_local,
                   (ulong)props_local._4_4_);
      }
    }
  }
  else {
    *error = -1;
    anon_unknown_0::Output
              ("ERROR: Got length %d, expected %d\n",(ulong)local_30[0],(ulong)(uint)expectedLength)
    ;
    anon_unknown_0::Output
              ("CALL: glGetProgramResourceiv, with %d, %d\n",(ulong)(uint)propCount_local,
               (ulong)props_local._4_4_);
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceiv(GLuint program, GLenum programInterface, GLuint index,
												   GLsizei propCount, const GLenum props[], GLsizei expectedLength,
												   const GLint expected[], long& error)
	{
		const GLsizei bufSize = 1000;
		GLsizei		  length;
		GLint		  params[bufSize];
		glGetProgramResourceiv(program, programInterface, index, propCount, props, bufSize, &length, params);
		if (length != expectedLength || length <= 0)
		{
			error = ERROR;
			Output("ERROR: Got length %d, expected %d\n", length, expectedLength);
			Output("CALL: glGetProgramResourceiv, with %d, %d\n", programInterface, index);
			return;
		}
		for (int i = 0; i < length; ++i)
		{
			if (params[i] != expected[i])
			{
				error = ERROR;
				Output("ERROR: Got %d, expected %d at: %d\n", params[i], expected[i], i);
				Output("CALL: glGetProgramResourceiv, with %d, %d\n", programInterface, index);
			}
		}
	}